

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

void __thiscall duckdb::CSVReaderOptions::SetNewline(CSVReaderOptions *this,string *input)

{
  bool bVar1;
  NewLineIdentifier NVar2;
  InvalidInputException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  bVar1 = ::std::operator==(input,"\\n");
  if (bVar1) {
    NVar2 = SINGLE_N;
  }
  else {
    bVar1 = ::std::operator==(input,"\\r");
    if (bVar1) {
      NVar2 = SINGLE_R;
    }
    else {
      bVar1 = ::std::operator==(input,"\\r\\n");
      if (!bVar1) {
        this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::operator+(&bStack_38,"This is not accepted as a newline: ",input);
        InvalidInputException::InvalidInputException(this_00,&bStack_38);
        __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      NVar2 = CARRY_ON;
    }
  }
  if ((this->dialect_options).state_machine_options.new_line.set_by_user == false) {
    (this->dialect_options).state_machine_options.new_line.value = NVar2;
    (this->dialect_options).state_machine_options.new_line.set_by_user = true;
  }
  return;
}

Assistant:

void CSVReaderOptions::SetNewline(const string &input) {
	if (input == "\\n") {
		dialect_options.state_machine_options.new_line.Set(NewLineIdentifier::SINGLE_N);
	} else if (input == "\\r") {
		dialect_options.state_machine_options.new_line.Set(NewLineIdentifier::SINGLE_R);
	} else if (input == "\\r\\n") {
		dialect_options.state_machine_options.new_line.Set(NewLineIdentifier::CARRY_ON);
	} else {
		throw InvalidInputException("This is not accepted as a newline: " + input);
	}
}